

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncAwait.h
# Opt level: O3

pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
async_simple::coro::
syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,std::__cxx11::string>>>
          (pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,coro *this,
          Lazy<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lazy)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  error_category *peVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  char cVar6;
  pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar7;
  logic_error *this_00;
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  Condition cond;
  Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value;
  __semaphore_impl local_5c;
  _Variant_storage<false,_std::monostate,_std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__exception_ptr::exception_ptr>
  local_58;
  type_conflict5 local_20;
  
  if (*(long **)(*(long *)this + 0x18) != (long *)0x0) {
    cVar6 = (**(code **)(**(long **)(*(long *)this + 0x18) + 0x18))();
    if (cVar6 != '\0') {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"do not sync await in the same executor with Lazy");
      syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,std::__cxx11::string>>>
                ((coro *)this_00);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__exception_ptr::exception_ptr>
      ::~_Variant_storage(&local_58);
      _Unwind_Resume(extraout_RAX);
    }
  }
  local_20.cond = (Condition *)&local_5c;
  local_5c._M_counter = 0;
  local_20.value =
       (Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&local_58;
  local_58._M_index = '\0';
  detail::
  LazyBase<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_async_simple_coro_SyncAwait_h:44:16)>
            ((LazyBase<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              *)this,&local_20);
  std::__atomic_wait_address_bare<std::__atomic_semaphore::_M_acquire()::_lambda()_1_>
            (&local_5c._M_counter,(anon_class_8_1_8991fb9c)&local_5c);
  ppVar7 = Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::value((Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_58);
  uVar5 = *(undefined4 *)&(ppVar7->first).field_0x4;
  peVar3 = (ppVar7->first)._M_cat;
  (__return_storage_ptr__->first)._M_value = (ppVar7->first)._M_value;
  *(undefined4 *)&(__return_storage_ptr__->first).field_0x4 = uVar5;
  (__return_storage_ptr__->first)._M_cat = peVar3;
  paVar1 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (ppVar7->second)._M_dataplus._M_p;
  paVar8 = &(ppVar7->second).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar8) {
    uVar4 = *(undefined8 *)((long)&(ppVar7->second).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = pcVar2;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  (__return_storage_ptr__->second)._M_string_length = (ppVar7->second)._M_string_length;
  (ppVar7->second)._M_dataplus._M_p = (pointer)paVar8;
  (ppVar7->second)._M_string_length = 0;
  (ppVar7->second).field_2._M_local_buf[0] = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__exception_ptr::exception_ptr>
  ::~_Variant_storage(&local_58);
  return __return_storage_ptr__;
}

Assistant:

inline auto syncAwait(LazyType &&lazy) {
    auto executor = lazy.getExecutor();
    if (executor)
        logicAssert(!executor->currentThreadInExecutor(),
                    "do not sync await in the same executor with Lazy");

    util::Condition cond;
    using ValueType = typename std::decay_t<LazyType>::ValueType;

    Try<ValueType> value;
    std::move(std::forward<LazyType>(lazy))
        .start([&cond, &value](Try<ValueType> result) {
            value = std::move(result);
            cond.release();
        });
    cond.acquire();
    return std::move(value).value();
}